

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct32_high28_stage6_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  uint uVar63;
  undefined4 uVar64;
  uint uVar65;
  int iVar66;
  char in_DL;
  long in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i cospi_m48_m16;
  __m128i cospi_p48_p16;
  __m128i cospi_m16_p48;
  __m128i cospi_p32_p32;
  __m128i cospi_m32_p32;
  undefined2 local_ba8;
  undefined2 uStack_ba6;
  undefined2 uStack_ba4;
  undefined2 uStack_ba2;
  undefined2 local_b98;
  undefined2 uStack_b96;
  undefined2 uStack_b94;
  undefined2 uStack_b92;
  undefined2 local_b88;
  undefined2 uStack_b86;
  undefined2 uStack_b84;
  undefined2 uStack_b82;
  undefined2 local_b78;
  undefined2 uStack_b76;
  undefined2 uStack_b74;
  undefined2 uStack_b72;
  undefined2 local_b68;
  undefined2 uStack_b66;
  undefined2 uStack_b64;
  undefined2 uStack_b62;
  undefined2 local_b58;
  undefined2 uStack_b56;
  undefined2 uStack_b54;
  undefined2 uStack_b52;
  undefined2 local_b48;
  undefined2 uStack_b46;
  undefined2 uStack_b44;
  undefined2 uStack_b42;
  undefined2 local_b38;
  undefined2 uStack_b36;
  undefined2 uStack_b34;
  undefined2 uStack_b32;
  undefined2 local_b28;
  undefined2 uStack_b26;
  undefined2 uStack_b24;
  undefined2 uStack_b22;
  undefined2 local_b18;
  undefined2 uStack_b16;
  undefined2 uStack_b14;
  undefined2 uStack_b12;
  undefined2 uStack_b00;
  undefined2 uStack_afe;
  undefined2 uStack_afc;
  undefined2 uStack_afa;
  undefined2 uStack_af0;
  undefined2 uStack_aee;
  undefined2 uStack_aec;
  undefined2 uStack_aea;
  undefined2 uStack_ae0;
  undefined2 uStack_ade;
  undefined2 uStack_adc;
  undefined2 uStack_ada;
  undefined2 uStack_ad0;
  undefined2 uStack_ace;
  undefined2 uStack_acc;
  undefined2 uStack_aca;
  undefined2 uStack_ac0;
  undefined2 uStack_abe;
  undefined2 uStack_abc;
  undefined2 uStack_aba;
  undefined2 uStack_ab0;
  undefined2 uStack_aae;
  undefined2 uStack_aac;
  undefined2 uStack_aaa;
  undefined2 uStack_aa0;
  undefined2 uStack_a9e;
  undefined2 uStack_a9c;
  undefined2 uStack_a9a;
  undefined2 uStack_a90;
  undefined2 uStack_a8e;
  undefined2 uStack_a8c;
  undefined2 uStack_a8a;
  undefined2 uStack_a80;
  undefined2 uStack_a7e;
  undefined2 uStack_a7c;
  undefined2 uStack_a7a;
  undefined2 uStack_a70;
  undefined2 uStack_a6e;
  undefined2 uStack_a6c;
  undefined2 uStack_a6a;
  undefined4 local_7d8;
  undefined4 uStack_7d4;
  undefined4 uStack_7d0;
  undefined4 uStack_7cc;
  undefined4 local_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  undefined4 local_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 local_778;
  undefined4 uStack_774;
  undefined4 uStack_770;
  undefined4 uStack_76c;
  undefined4 local_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 local_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  undefined4 local_718;
  undefined4 uStack_714;
  undefined4 uStack_710;
  undefined4 uStack_70c;
  undefined4 local_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  undefined4 local_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined4 local_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 local_678;
  undefined4 uStack_674;
  undefined4 uStack_670;
  undefined4 uStack_66c;
  undefined4 local_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined4 local_638;
  undefined4 uStack_634;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  undefined4 local_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 local_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 local_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 local_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 local_588;
  undefined4 uStack_584;
  undefined4 uStack_580;
  undefined4 uStack_57c;
  undefined4 local_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  
  uVar63 = -*(int *)(in_RSI + 0x80) & 0xffffU | *(int *)(in_RSI + 0x80) << 0x10;
  uVar64 = CONCAT22(*(undefined2 *)(in_RSI + 0x80),*(undefined2 *)(in_RSI + 0x80));
  uVar65 = -*(int *)(in_RSI + 0x40) & 0xffffU | *(int *)(in_RSI + 0xc0) << 0x10;
  uVar57 = CONCAT44(uVar65,uVar65);
  uVar58 = CONCAT44(uVar65,uVar65);
  uVar65 = (uint)*(ushort *)(in_RSI + 0xc0) | *(int *)(in_RSI + 0x40) << 0x10;
  uVar59 = CONCAT44(uVar65,uVar65);
  uVar60 = CONCAT44(uVar65,uVar65);
  iVar66 = (-*(int *)(in_RSI + 0xc0) & 0xffffU) + *(int *)(in_RSI + 0x40) * -0x10000;
  uVar61 = CONCAT44(iVar66,iVar66);
  uVar62 = CONCAT44(iVar66,iVar66);
  uVar1 = *(undefined8 *)(in_RDI + 0x50);
  uVar2 = *(undefined8 *)(in_RDI + 0x60);
  local_b18 = (undefined2)uVar1;
  uStack_b16 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_b14 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_b12 = (undefined2)((ulong)uVar1 >> 0x30);
  local_b28 = (undefined2)uVar2;
  uStack_b26 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_b24 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_b22 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x58);
  uVar2 = *(undefined8 *)(in_RDI + 0x68);
  uStack_a70 = (undefined2)uVar1;
  uStack_a6e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_a6c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_a6a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_a80 = (undefined2)uVar2;
  uStack_a7e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_a7c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_a7a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar36._2_2_ = local_b28;
  auVar36._0_2_ = local_b18;
  auVar36._4_2_ = uStack_b16;
  auVar36._6_2_ = uStack_b26;
  auVar36._10_2_ = uStack_b24;
  auVar36._8_2_ = uStack_b14;
  auVar36._12_2_ = uStack_b12;
  auVar36._14_2_ = uStack_b22;
  auVar35._8_8_ = CONCAT44(uVar63,uVar63);
  auVar35._0_8_ = CONCAT44(uVar63,uVar63);
  auVar67 = pmaddwd(auVar36,auVar35);
  auVar34._2_2_ = uStack_a80;
  auVar34._0_2_ = uStack_a70;
  auVar34._4_2_ = uStack_a6e;
  auVar34._6_2_ = uStack_a7e;
  auVar34._10_2_ = uStack_a7c;
  auVar34._8_2_ = uStack_a6c;
  auVar34._12_2_ = uStack_a6a;
  auVar34._14_2_ = uStack_a7a;
  auVar33._8_8_ = CONCAT44(uVar63,uVar63);
  auVar33._0_8_ = CONCAT44(uVar63,uVar63);
  auVar68 = pmaddwd(auVar34,auVar33);
  auVar32._2_2_ = local_b28;
  auVar32._0_2_ = local_b18;
  auVar32._4_2_ = uStack_b16;
  auVar32._6_2_ = uStack_b26;
  auVar32._10_2_ = uStack_b24;
  auVar32._8_2_ = uStack_b14;
  auVar32._12_2_ = uStack_b12;
  auVar32._14_2_ = uStack_b22;
  auVar31._8_8_ = CONCAT44(uVar64,uVar64);
  auVar31._0_8_ = CONCAT44(uVar64,uVar64);
  auVar69 = pmaddwd(auVar32,auVar31);
  auVar30._2_2_ = uStack_a80;
  auVar30._0_2_ = uStack_a70;
  auVar30._4_2_ = uStack_a6e;
  auVar30._6_2_ = uStack_a7e;
  auVar30._10_2_ = uStack_a7c;
  auVar30._8_2_ = uStack_a6c;
  auVar30._12_2_ = uStack_a6a;
  auVar30._14_2_ = uStack_a7a;
  auVar29._8_8_ = CONCAT44(uVar64,uVar64);
  auVar29._0_8_ = CONCAT44(uVar64,uVar64);
  auVar70 = pmaddwd(auVar30,auVar29);
  local_578 = auVar67._0_4_;
  uStack_574 = auVar67._4_4_;
  uStack_570 = auVar67._8_4_;
  uStack_56c = auVar67._12_4_;
  local_588 = (int)in_XMM0_Qa;
  uStack_584 = (int)((ulong)in_XMM0_Qa >> 0x20);
  uStack_580 = (int)in_XMM0_Qb;
  uStack_57c = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_598 = auVar68._0_4_;
  uStack_594 = auVar68._4_4_;
  uStack_590 = auVar68._8_4_;
  uStack_58c = auVar68._12_4_;
  local_5b8 = auVar69._0_4_;
  uStack_5b4 = auVar69._4_4_;
  uStack_5b0 = auVar69._8_4_;
  uStack_5ac = auVar69._12_4_;
  local_5d8 = auVar70._0_4_;
  uStack_5d4 = auVar70._4_4_;
  uStack_5d0 = auVar70._8_4_;
  uStack_5cc = auVar70._12_4_;
  auVar67 = ZEXT416((uint)(int)in_DL);
  auVar68 = ZEXT416((uint)(int)in_DL);
  auVar69 = ZEXT416((uint)(int)in_DL);
  auVar70 = ZEXT416((uint)(int)in_DL);
  auVar56._4_4_ = uStack_574 + uStack_584 >> auVar67;
  auVar56._0_4_ = local_578 + local_588 >> auVar67;
  auVar56._12_4_ = uStack_56c + uStack_57c >> auVar67;
  auVar56._8_4_ = uStack_570 + uStack_580 >> auVar67;
  auVar55._4_4_ = uStack_594 + uStack_584 >> auVar68;
  auVar55._0_4_ = local_598 + local_588 >> auVar68;
  auVar55._12_4_ = uStack_58c + uStack_57c >> auVar68;
  auVar55._8_4_ = uStack_590 + uStack_580 >> auVar68;
  auVar67 = packssdw(auVar56,auVar55);
  *(undefined1 (*) [16])(in_RDI + 0x50) = auVar67;
  auVar54._4_4_ = uStack_5b4 + uStack_584 >> auVar69;
  auVar54._0_4_ = local_5b8 + local_588 >> auVar69;
  auVar54._12_4_ = uStack_5ac + uStack_57c >> auVar69;
  auVar54._8_4_ = uStack_5b0 + uStack_580 >> auVar69;
  auVar53._4_4_ = uStack_5d4 + uStack_584 >> auVar70;
  auVar53._0_4_ = local_5d8 + local_588 >> auVar70;
  auVar53._12_4_ = uStack_5cc + uStack_57c >> auVar70;
  auVar53._8_4_ = uStack_5d0 + uStack_580 >> auVar70;
  auVar67 = packssdw(auVar54,auVar53);
  *(undefined1 (*) [16])(in_RDI + 0x60) = auVar67;
  auVar67 = *(undefined1 (*) [16])(in_RDI + 0x80);
  auVar68 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x80),*(undefined1 (*) [16])(in_RDI + 0xb0));
  *(undefined1 (*) [16])(in_RDI + 0x80) = auVar68;
  auVar67 = psubsw(auVar67,*(undefined1 (*) [16])(in_RDI + 0xb0));
  *(undefined1 (*) [16])(in_RDI + 0xb0) = auVar67;
  auVar67 = *(undefined1 (*) [16])(in_RDI + 0x90);
  auVar68 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x90),*(undefined1 (*) [16])(in_RDI + 0xa0));
  *(undefined1 (*) [16])(in_RDI + 0x90) = auVar68;
  auVar67 = psubsw(auVar67,*(undefined1 (*) [16])(in_RDI + 0xa0));
  *(undefined1 (*) [16])(in_RDI + 0xa0) = auVar67;
  auVar67 = *(undefined1 (*) [16])(in_RDI + 0xc0);
  auVar68 = psubsw(*(undefined1 (*) [16])(in_RDI + 0xf0),*(undefined1 (*) [16])(in_RDI + 0xc0));
  *(undefined1 (*) [16])(in_RDI + 0xc0) = auVar68;
  auVar67 = paddsw(*(undefined1 (*) [16])(in_RDI + 0xf0),auVar67);
  *(undefined1 (*) [16])(in_RDI + 0xf0) = auVar67;
  auVar67 = *(undefined1 (*) [16])(in_RDI + 0xd0);
  auVar68 = psubsw(*(undefined1 (*) [16])(in_RDI + 0xe0),*(undefined1 (*) [16])(in_RDI + 0xd0));
  *(undefined1 (*) [16])(in_RDI + 0xd0) = auVar68;
  auVar67 = paddsw(*(undefined1 (*) [16])(in_RDI + 0xe0),auVar67);
  *(undefined1 (*) [16])(in_RDI + 0xe0) = auVar67;
  uVar1 = *(undefined8 *)(in_RDI + 0x120);
  uVar2 = *(undefined8 *)(in_RDI + 0x1d0);
  local_b38 = (undefined2)uVar1;
  uStack_b36 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_b34 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_b32 = (undefined2)((ulong)uVar1 >> 0x30);
  local_b48 = (undefined2)uVar2;
  uStack_b46 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_b44 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_b42 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x128);
  uVar2 = *(undefined8 *)(in_RDI + 0x1d8);
  uStack_a90 = (undefined2)uVar1;
  uStack_a8e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_a8c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_a8a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_aa0 = (undefined2)uVar2;
  uStack_a9e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_a9c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_a9a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar28._2_2_ = local_b48;
  auVar28._0_2_ = local_b38;
  auVar28._4_2_ = uStack_b36;
  auVar28._6_2_ = uStack_b46;
  auVar28._10_2_ = uStack_b44;
  auVar28._8_2_ = uStack_b34;
  auVar28._12_2_ = uStack_b32;
  auVar28._14_2_ = uStack_b42;
  auVar27._8_8_ = uVar58;
  auVar27._0_8_ = uVar57;
  auVar67 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_aa0;
  auVar26._0_2_ = uStack_a90;
  auVar26._4_2_ = uStack_a8e;
  auVar26._6_2_ = uStack_a9e;
  auVar26._10_2_ = uStack_a9c;
  auVar26._8_2_ = uStack_a8c;
  auVar26._12_2_ = uStack_a8a;
  auVar26._14_2_ = uStack_a9a;
  auVar25._8_8_ = uVar58;
  auVar25._0_8_ = uVar57;
  auVar68 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = local_b48;
  auVar24._0_2_ = local_b38;
  auVar24._4_2_ = uStack_b36;
  auVar24._6_2_ = uStack_b46;
  auVar24._10_2_ = uStack_b44;
  auVar24._8_2_ = uStack_b34;
  auVar24._12_2_ = uStack_b32;
  auVar24._14_2_ = uStack_b42;
  auVar23._8_8_ = uVar60;
  auVar23._0_8_ = uVar59;
  auVar69 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = uStack_aa0;
  auVar22._0_2_ = uStack_a90;
  auVar22._4_2_ = uStack_a8e;
  auVar22._6_2_ = uStack_a9e;
  auVar22._10_2_ = uStack_a9c;
  auVar22._8_2_ = uStack_a8c;
  auVar22._12_2_ = uStack_a8a;
  auVar22._14_2_ = uStack_a9a;
  auVar21._8_8_ = uVar60;
  auVar21._0_8_ = uVar59;
  auVar70 = pmaddwd(auVar22,auVar21);
  local_5f8 = auVar67._0_4_;
  uStack_5f4 = auVar67._4_4_;
  uStack_5f0 = auVar67._8_4_;
  uStack_5ec = auVar67._12_4_;
  local_618 = auVar68._0_4_;
  uStack_614 = auVar68._4_4_;
  uStack_610 = auVar68._8_4_;
  uStack_60c = auVar68._12_4_;
  local_638 = auVar69._0_4_;
  uStack_634 = auVar69._4_4_;
  uStack_630 = auVar69._8_4_;
  uStack_62c = auVar69._12_4_;
  local_658 = auVar70._0_4_;
  uStack_654 = auVar70._4_4_;
  uStack_650 = auVar70._8_4_;
  uStack_64c = auVar70._12_4_;
  auVar67 = ZEXT416((uint)(int)in_DL);
  auVar68 = ZEXT416((uint)(int)in_DL);
  auVar69 = ZEXT416((uint)(int)in_DL);
  auVar70 = ZEXT416((uint)(int)in_DL);
  auVar52._4_4_ = uStack_5f4 + uStack_584 >> auVar67;
  auVar52._0_4_ = local_5f8 + local_588 >> auVar67;
  auVar52._12_4_ = uStack_5ec + uStack_57c >> auVar67;
  auVar52._8_4_ = uStack_5f0 + uStack_580 >> auVar67;
  auVar51._4_4_ = uStack_614 + uStack_584 >> auVar68;
  auVar51._0_4_ = local_618 + local_588 >> auVar68;
  auVar51._12_4_ = uStack_60c + uStack_57c >> auVar68;
  auVar51._8_4_ = uStack_610 + uStack_580 >> auVar68;
  auVar67 = packssdw(auVar52,auVar51);
  *(undefined1 (*) [16])(in_RDI + 0x120) = auVar67;
  auVar50._4_4_ = uStack_634 + uStack_584 >> auVar69;
  auVar50._0_4_ = local_638 + local_588 >> auVar69;
  auVar50._12_4_ = uStack_62c + uStack_57c >> auVar69;
  auVar50._8_4_ = uStack_630 + uStack_580 >> auVar69;
  auVar49._4_4_ = uStack_654 + uStack_584 >> auVar70;
  auVar49._0_4_ = local_658 + local_588 >> auVar70;
  auVar49._12_4_ = uStack_64c + uStack_57c >> auVar70;
  auVar49._8_4_ = uStack_650 + uStack_580 >> auVar70;
  auVar67 = packssdw(auVar50,auVar49);
  *(undefined1 (*) [16])(in_RDI + 0x1d0) = auVar67;
  uVar1 = *(undefined8 *)(in_RDI + 0x130);
  uVar2 = *(undefined8 *)(in_RDI + 0x1c0);
  local_b58 = (undefined2)uVar1;
  uStack_b56 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_b54 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_b52 = (undefined2)((ulong)uVar1 >> 0x30);
  local_b68 = (undefined2)uVar2;
  uStack_b66 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_b64 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_b62 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x138);
  uVar2 = *(undefined8 *)(in_RDI + 0x1c8);
  uStack_ab0 = (undefined2)uVar1;
  uStack_aae = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_aac = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_aaa = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_ac0 = (undefined2)uVar2;
  uStack_abe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_abc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_aba = (undefined2)((ulong)uVar2 >> 0x30);
  auVar20._2_2_ = local_b68;
  auVar20._0_2_ = local_b58;
  auVar20._4_2_ = uStack_b56;
  auVar20._6_2_ = uStack_b66;
  auVar20._10_2_ = uStack_b64;
  auVar20._8_2_ = uStack_b54;
  auVar20._12_2_ = uStack_b52;
  auVar20._14_2_ = uStack_b62;
  auVar19._8_8_ = uVar58;
  auVar19._0_8_ = uVar57;
  auVar67 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_ac0;
  auVar18._0_2_ = uStack_ab0;
  auVar18._4_2_ = uStack_aae;
  auVar18._6_2_ = uStack_abe;
  auVar18._10_2_ = uStack_abc;
  auVar18._8_2_ = uStack_aac;
  auVar18._12_2_ = uStack_aaa;
  auVar18._14_2_ = uStack_aba;
  auVar17._8_8_ = uVar58;
  auVar17._0_8_ = uVar57;
  auVar68 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = local_b68;
  auVar16._0_2_ = local_b58;
  auVar16._4_2_ = uStack_b56;
  auVar16._6_2_ = uStack_b66;
  auVar16._10_2_ = uStack_b64;
  auVar16._8_2_ = uStack_b54;
  auVar16._12_2_ = uStack_b52;
  auVar16._14_2_ = uStack_b62;
  auVar15._8_8_ = uVar60;
  auVar15._0_8_ = uVar59;
  auVar69 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_ac0;
  auVar14._0_2_ = uStack_ab0;
  auVar14._4_2_ = uStack_aae;
  auVar14._6_2_ = uStack_abe;
  auVar14._10_2_ = uStack_abc;
  auVar14._8_2_ = uStack_aac;
  auVar14._12_2_ = uStack_aaa;
  auVar14._14_2_ = uStack_aba;
  auVar13._8_8_ = uVar60;
  auVar13._0_8_ = uVar59;
  auVar70 = pmaddwd(auVar14,auVar13);
  local_678 = auVar67._0_4_;
  uStack_674 = auVar67._4_4_;
  uStack_670 = auVar67._8_4_;
  uStack_66c = auVar67._12_4_;
  local_698 = auVar68._0_4_;
  uStack_694 = auVar68._4_4_;
  uStack_690 = auVar68._8_4_;
  uStack_68c = auVar68._12_4_;
  local_6b8 = auVar69._0_4_;
  uStack_6b4 = auVar69._4_4_;
  uStack_6b0 = auVar69._8_4_;
  uStack_6ac = auVar69._12_4_;
  local_6d8 = auVar70._0_4_;
  uStack_6d4 = auVar70._4_4_;
  uStack_6d0 = auVar70._8_4_;
  uStack_6cc = auVar70._12_4_;
  auVar67 = ZEXT416((uint)(int)in_DL);
  auVar68 = ZEXT416((uint)(int)in_DL);
  auVar69 = ZEXT416((uint)(int)in_DL);
  auVar70 = ZEXT416((uint)(int)in_DL);
  auVar48._4_4_ = uStack_674 + uStack_584 >> auVar67;
  auVar48._0_4_ = local_678 + local_588 >> auVar67;
  auVar48._12_4_ = uStack_66c + uStack_57c >> auVar67;
  auVar48._8_4_ = uStack_670 + uStack_580 >> auVar67;
  auVar47._4_4_ = uStack_694 + uStack_584 >> auVar68;
  auVar47._0_4_ = local_698 + local_588 >> auVar68;
  auVar47._12_4_ = uStack_68c + uStack_57c >> auVar68;
  auVar47._8_4_ = uStack_690 + uStack_580 >> auVar68;
  auVar67 = packssdw(auVar48,auVar47);
  *(undefined1 (*) [16])(in_RDI + 0x130) = auVar67;
  auVar46._4_4_ = uStack_6b4 + uStack_584 >> auVar69;
  auVar46._0_4_ = local_6b8 + local_588 >> auVar69;
  auVar46._12_4_ = uStack_6ac + uStack_57c >> auVar69;
  auVar46._8_4_ = uStack_6b0 + uStack_580 >> auVar69;
  auVar45._4_4_ = uStack_6d4 + uStack_584 >> auVar70;
  auVar45._0_4_ = local_6d8 + local_588 >> auVar70;
  auVar45._12_4_ = uStack_6cc + uStack_57c >> auVar70;
  auVar45._8_4_ = uStack_6d0 + uStack_580 >> auVar70;
  auVar67 = packssdw(auVar46,auVar45);
  *(undefined1 (*) [16])(in_RDI + 0x1c0) = auVar67;
  uVar1 = *(undefined8 *)(in_RDI + 0x140);
  uVar2 = *(undefined8 *)(in_RDI + 0x1b0);
  local_b78 = (undefined2)uVar1;
  uStack_b76 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_b74 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_b72 = (undefined2)((ulong)uVar1 >> 0x30);
  local_b88 = (undefined2)uVar2;
  uStack_b86 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_b84 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_b82 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x148);
  uVar2 = *(undefined8 *)(in_RDI + 0x1b8);
  uStack_ad0 = (undefined2)uVar1;
  uStack_ace = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_acc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_aca = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_ae0 = (undefined2)uVar2;
  uStack_ade = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_adc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_ada = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_b88;
  auVar12._0_2_ = local_b78;
  auVar12._4_2_ = uStack_b76;
  auVar12._6_2_ = uStack_b86;
  auVar12._10_2_ = uStack_b84;
  auVar12._8_2_ = uStack_b74;
  auVar12._12_2_ = uStack_b72;
  auVar12._14_2_ = uStack_b82;
  auVar11._8_8_ = uVar62;
  auVar11._0_8_ = uVar61;
  auVar67 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_ae0;
  auVar10._0_2_ = uStack_ad0;
  auVar10._4_2_ = uStack_ace;
  auVar10._6_2_ = uStack_ade;
  auVar10._10_2_ = uStack_adc;
  auVar10._8_2_ = uStack_acc;
  auVar10._12_2_ = uStack_aca;
  auVar10._14_2_ = uStack_ada;
  auVar9._8_8_ = uVar62;
  auVar9._0_8_ = uVar61;
  auVar68 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_b88;
  auVar8._0_2_ = local_b78;
  auVar8._4_2_ = uStack_b76;
  auVar8._6_2_ = uStack_b86;
  auVar8._10_2_ = uStack_b84;
  auVar8._8_2_ = uStack_b74;
  auVar8._12_2_ = uStack_b72;
  auVar8._14_2_ = uStack_b82;
  auVar7._8_8_ = uVar58;
  auVar7._0_8_ = uVar57;
  auVar69 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_ae0;
  auVar6._0_2_ = uStack_ad0;
  auVar6._4_2_ = uStack_ace;
  auVar6._6_2_ = uStack_ade;
  auVar6._10_2_ = uStack_adc;
  auVar6._8_2_ = uStack_acc;
  auVar6._12_2_ = uStack_aca;
  auVar6._14_2_ = uStack_ada;
  auVar5._8_8_ = uVar58;
  auVar5._0_8_ = uVar57;
  auVar70 = pmaddwd(auVar6,auVar5);
  local_6f8 = auVar67._0_4_;
  uStack_6f4 = auVar67._4_4_;
  uStack_6f0 = auVar67._8_4_;
  uStack_6ec = auVar67._12_4_;
  local_718 = auVar68._0_4_;
  uStack_714 = auVar68._4_4_;
  uStack_710 = auVar68._8_4_;
  uStack_70c = auVar68._12_4_;
  local_738 = auVar69._0_4_;
  uStack_734 = auVar69._4_4_;
  uStack_730 = auVar69._8_4_;
  uStack_72c = auVar69._12_4_;
  local_758 = auVar70._0_4_;
  uStack_754 = auVar70._4_4_;
  uStack_750 = auVar70._8_4_;
  uStack_74c = auVar70._12_4_;
  auVar67 = ZEXT416((uint)(int)in_DL);
  auVar68 = ZEXT416((uint)(int)in_DL);
  auVar69 = ZEXT416((uint)(int)in_DL);
  auVar70 = ZEXT416((uint)(int)in_DL);
  auVar44._4_4_ = uStack_6f4 + uStack_584 >> auVar67;
  auVar44._0_4_ = local_6f8 + local_588 >> auVar67;
  auVar44._12_4_ = uStack_6ec + uStack_57c >> auVar67;
  auVar44._8_4_ = uStack_6f0 + uStack_580 >> auVar67;
  auVar43._4_4_ = uStack_714 + uStack_584 >> auVar68;
  auVar43._0_4_ = local_718 + local_588 >> auVar68;
  auVar43._12_4_ = uStack_70c + uStack_57c >> auVar68;
  auVar43._8_4_ = uStack_710 + uStack_580 >> auVar68;
  auVar67 = packssdw(auVar44,auVar43);
  *(undefined1 (*) [16])(in_RDI + 0x140) = auVar67;
  auVar42._4_4_ = uStack_734 + uStack_584 >> auVar69;
  auVar42._0_4_ = local_738 + local_588 >> auVar69;
  auVar42._12_4_ = uStack_72c + uStack_57c >> auVar69;
  auVar42._8_4_ = uStack_730 + uStack_580 >> auVar69;
  auVar41._4_4_ = uStack_754 + uStack_584 >> auVar70;
  auVar41._0_4_ = local_758 + local_588 >> auVar70;
  auVar41._12_4_ = uStack_74c + uStack_57c >> auVar70;
  auVar41._8_4_ = uStack_750 + uStack_580 >> auVar70;
  auVar67 = packssdw(auVar42,auVar41);
  *(undefined1 (*) [16])(in_RDI + 0x1b0) = auVar67;
  uVar1 = *(undefined8 *)(in_RDI + 0x150);
  uVar2 = *(undefined8 *)(in_RDI + 0x1a0);
  local_b98 = (undefined2)uVar1;
  uStack_b96 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_b94 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_b92 = (undefined2)((ulong)uVar1 >> 0x30);
  local_ba8 = (undefined2)uVar2;
  uStack_ba6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_ba4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_ba2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x158);
  uVar2 = *(undefined8 *)(in_RDI + 0x1a8);
  uStack_af0 = (undefined2)uVar1;
  uStack_aee = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_aec = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_aea = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_b00 = (undefined2)uVar2;
  uStack_afe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_afc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_afa = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_ba8;
  auVar4._0_2_ = local_b98;
  auVar4._4_2_ = uStack_b96;
  auVar4._6_2_ = uStack_ba6;
  auVar4._10_2_ = uStack_ba4;
  auVar4._8_2_ = uStack_b94;
  auVar4._12_2_ = uStack_b92;
  auVar4._14_2_ = uStack_ba2;
  auVar71._8_8_ = uVar62;
  auVar71._0_8_ = uVar61;
  auVar71 = pmaddwd(auVar4,auVar71);
  auVar3._2_2_ = uStack_b00;
  auVar3._0_2_ = uStack_af0;
  auVar3._4_2_ = uStack_aee;
  auVar3._6_2_ = uStack_afe;
  auVar3._10_2_ = uStack_afc;
  auVar3._8_2_ = uStack_aec;
  auVar3._12_2_ = uStack_aea;
  auVar3._14_2_ = uStack_afa;
  auVar72._8_8_ = uVar62;
  auVar72._0_8_ = uVar61;
  auVar72 = pmaddwd(auVar3,auVar72);
  auVar70._2_2_ = local_ba8;
  auVar70._0_2_ = local_b98;
  auVar70._4_2_ = uStack_b96;
  auVar70._6_2_ = uStack_ba6;
  auVar70._10_2_ = uStack_ba4;
  auVar70._8_2_ = uStack_b94;
  auVar70._12_2_ = uStack_b92;
  auVar70._14_2_ = uStack_ba2;
  auVar69._8_8_ = uVar58;
  auVar69._0_8_ = uVar57;
  auVar69 = pmaddwd(auVar70,auVar69);
  auVar68._2_2_ = uStack_b00;
  auVar68._0_2_ = uStack_af0;
  auVar68._4_2_ = uStack_aee;
  auVar68._6_2_ = uStack_afe;
  auVar68._10_2_ = uStack_afc;
  auVar68._8_2_ = uStack_aec;
  auVar68._12_2_ = uStack_aea;
  auVar68._14_2_ = uStack_afa;
  auVar67._8_8_ = uVar58;
  auVar67._0_8_ = uVar57;
  auVar67 = pmaddwd(auVar68,auVar67);
  local_778 = auVar71._0_4_;
  uStack_774 = auVar71._4_4_;
  uStack_770 = auVar71._8_4_;
  uStack_76c = auVar71._12_4_;
  local_798 = auVar72._0_4_;
  uStack_794 = auVar72._4_4_;
  uStack_790 = auVar72._8_4_;
  uStack_78c = auVar72._12_4_;
  local_7b8 = auVar69._0_4_;
  uStack_7b4 = auVar69._4_4_;
  uStack_7b0 = auVar69._8_4_;
  uStack_7ac = auVar69._12_4_;
  local_7d8 = auVar67._0_4_;
  uStack_7d4 = auVar67._4_4_;
  uStack_7d0 = auVar67._8_4_;
  uStack_7cc = auVar67._12_4_;
  auVar67 = ZEXT416((uint)(int)in_DL);
  auVar68 = ZEXT416((uint)(int)in_DL);
  auVar69 = ZEXT416((uint)(int)in_DL);
  auVar70 = ZEXT416((uint)(int)in_DL);
  auVar40._4_4_ = uStack_774 + uStack_584 >> auVar67;
  auVar40._0_4_ = local_778 + local_588 >> auVar67;
  auVar40._12_4_ = uStack_76c + uStack_57c >> auVar67;
  auVar40._8_4_ = uStack_770 + uStack_580 >> auVar67;
  auVar39._4_4_ = uStack_794 + uStack_584 >> auVar68;
  auVar39._0_4_ = local_798 + local_588 >> auVar68;
  auVar39._12_4_ = uStack_78c + uStack_57c >> auVar68;
  auVar39._8_4_ = uStack_790 + uStack_580 >> auVar68;
  auVar67 = packssdw(auVar40,auVar39);
  *(undefined1 (*) [16])(in_RDI + 0x150) = auVar67;
  auVar38._4_4_ = uStack_7b4 + uStack_584 >> auVar69;
  auVar38._0_4_ = local_7b8 + local_588 >> auVar69;
  auVar38._12_4_ = uStack_7ac + uStack_57c >> auVar69;
  auVar38._8_4_ = uStack_7b0 + uStack_580 >> auVar69;
  auVar37._4_4_ = uStack_7d4 + uStack_584 >> auVar70;
  auVar37._0_4_ = local_7d8 + local_588 >> auVar70;
  auVar37._12_4_ = uStack_7cc + uStack_57c >> auVar70;
  auVar37._8_4_ = uStack_7d0 + uStack_580 >> auVar70;
  auVar67 = packssdw(auVar38,auVar37);
  *(undefined1 (*) [16])(in_RDI + 0x1a0) = auVar67;
  return;
}

Assistant:

static inline void idct32_high28_stage6_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[18], x[29], x[18], x[29]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[19], x[28], x[19], x[28]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[20], x[27], x[20], x[27]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[21], x[26], x[21], x[26]);
}